

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  anon_struct_56_7_e267023e gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  ulong *local_178;
  sysbvm_tuple_t *psStack_170;
  sysbvm_tuple_t local_168;
  sysbvm_tuple_t sStack_160;
  sysbvm_tuple_t local_158;
  sysbvm_tuple_t sStack_150;
  sysbvm_tuple_t local_148;
  sysbvm_stackFrameRecord_t local_140;
  undefined8 local_130;
  sysbvm_stackFrameRecord_t local_128;
  undefined8 local_118;
  undefined1 *local_110;
  sysbvm_functionCallFrameStack_t local_108;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  anon_struct_136_2_7a050327_for_gcRoots *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_158 = 0;
  sStack_150 = 0;
  local_168 = 0;
  sStack_160 = 0;
  local_178 = (ulong *)0x0;
  psStack_170 = (sysbvm_tuple_t *)0x0;
  local_148 = 0;
  local_128.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_128.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_128._12_4_ = 0;
  local_118 = 7;
  local_110 = (undefined1 *)&local_178;
  sysbvm_stackFrame_pushRecord(&local_128);
  local_140.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_140.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_130 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_140);
  local_178 = (ulong *)sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  uVar5 = (ulong)local_178 & 0xf;
  if (uVar5 == 0 && local_178 != (ulong *)0x0) {
    psStack_170 = (sysbvm_tuple_t *)*local_178;
  }
  else if ((int)uVar5 == 0xf) {
    psStack_170 = (sysbvm_tuple_t *)
                  sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_178 >> 4);
  }
  else {
    psStack_170 = (sysbvm_tuple_t *)sysbvm_tuple_getImmediateTypeWithTag(context,uVar5);
  }
  uVar5 = (ulong)psStack_170 & 0xf;
  if (uVar5 == 0 && psStack_170 != (sysbvm_tuple_t *)0x0) {
    sVar2 = *psStack_170;
  }
  else if ((int)uVar5 == 0xf) {
    sVar2 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psStack_170 >> 4);
  }
  else {
    sVar2 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar5);
  }
  local_168 = sysbvm_type_getAnalyzeAndEvaluateUnexpandedApplicationNodeOfWithEnvironmentFunction
                        (context,sVar2);
  if (local_168 == 0) {
    if (((((ulong)local_178 & 0xf) == 0 && local_178 != (ulong *)0x0) &&
        (uVar5 = *local_178, (uVar5 & 0xf) == 0 && uVar5 != 0)) &&
       ((*(byte *)(uVar5 + 8) & 0x80) == 0)) {
      uVar5 = *(ulong *)(uVar5 + 0x70);
      if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
        uVar3 = (uint)((long)uVar5 >> 4);
      }
      else {
        uVar3 = (uint)*(undefined8 *)(uVar5 + 0x10);
      }
      if ((uVar3 >> 0xc & 1) != 0) {
        uVar5 = local_178[5];
        if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
          uVar5 = (long)uVar5 >> 4;
        }
        else {
          uVar5 = *(ulong *)(uVar5 + 0x10);
        }
        if ((uVar5 & 1) != 0) {
          sStack_160 = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro
                                 (context,arguments,(sysbvm_tuple_t *)&local_178,arguments + 1);
          sysbvm_stackFrame_popRecord(&local_140);
          sysbvm_stackFrame_popRecord(&local_128);
          sVar2 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                            (context,sStack_160,arguments[1]);
          return sVar2;
        }
      }
    }
    memset(&local_108,0,0xb0);
    local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_58._12_4_ = 0;
    local_48 = 0x11;
    local_40 = &local_108.gcRoots;
    sysbvm_stackFrame_pushRecord(&local_58);
    uVar5 = *(ulong *)(*arguments + 0x30);
    if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
      sysbvm_functionCallFrameStack_begin(context,&local_108,(sysbvm_tuple_t)local_178,0,0);
    }
    else {
      uVar3 = *(uint *)(uVar5 + 0xc);
      uVar5 = (ulong)(uVar3 >> 3);
      sysbvm_functionCallFrameStack_begin(context,&local_108,(sysbvm_tuple_t)local_178,uVar5,0);
      if (7 < uVar3) {
        uVar4 = 0;
        do {
          uVar1 = *(ulong *)(*arguments + 0x30);
          if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
            local_158 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar4 * 8);
          }
          else {
            local_158 = 0;
          }
          sStack_150 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                                 (context,local_158,arguments[1]);
          sysbvm_functionCallFrameStack_push(&local_108,sStack_150);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
    }
    sysbvm_stackFrame_popRecord(&local_140);
    sysbvm_stackFrame_popRecord(&local_128);
    local_148 = sysbvm_functionCallFrameStack_finish(context,&local_108);
  }
  else {
    local_108._8_8_ = *arguments;
    local_108.variadicArgumentIndex = arguments[1];
    local_108.applicationFlags = (sysbvm_bitflags_t)psStack_170;
    local_108.expectedArgumentCount = (size_t)local_178;
    local_148 = sysbvm_function_apply(context,local_168,4,&local_108.applicationFlags,0);
    sysbvm_stackFrame_popRecord(&local_140);
    sysbvm_stackFrame_popRecord(&local_128);
  }
  return local_148;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedApplicationNode_t **unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t**)node;

    struct {
        sysbvm_tuple_t functionOrMacro;
        sysbvm_tuple_t functionOrMacroExpressionType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedNode)->super.sourcePosition);

    gcFrame.functionOrMacro = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*unexpandedNode)->functionOrMacroExpression, *environment);
    gcFrame.functionOrMacroExpressionType = sysbvm_tuple_getType(context, gcFrame.functionOrMacro);
    gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndEvaluateUnexpandedApplicationNodeOfWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.functionOrMacroExpressionType));
    if(gcFrame.analysisFunction)
    {
        gcFrame.result = sysbvm_function_apply4(context, gcFrame.analysisFunction, gcFrame.functionOrMacroExpressionType, (sysbvm_tuple_t)*unexpandedNode, gcFrame.functionOrMacro, *environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }

    bool isMacro = sysbvm_function_isMacro(context, gcFrame.functionOrMacro);
    if(isMacro)
    {
        gcFrame.expansionResult = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro(context, node, &gcFrame.functionOrMacro, environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    size_t applicationArgumentCount = sysbvm_array_getSize((*unexpandedNode)->arguments);
    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.functionOrMacro, applicationArgumentCount, 0);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*unexpandedNode)->arguments, i);
        gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
    }

    //SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}